

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGhsMultiGenerator.cxx
# Opt level: O2

string * __thiscall
cmLocalGhsMultiGenerator::GetTargetDirectory_abi_cxx11_
          (string *__return_storage_ptr__,cmLocalGhsMultiGenerator *this,cmGeneratorTarget *target)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  cmGeneratorTarget::GetName_abi_cxx11_(target);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalGhsMultiGenerator::GetTargetDirectory(
  cmGeneratorTarget const* target) const
{
  std::string dir;
  dir += target->GetName();
  dir += ".dir";
  return dir;
}